

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v9::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  size_t sVar5;
  char *pcVar6;
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 value_00 [16];
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  runtime_error *this;
  ulong uVar11;
  bigint *lhs2;
  ulong uVar12;
  int iVar13;
  long lVar14;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  bigint *local_330;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  uVar11 = (ulong)(uint)num_digits;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00123bc0;
  puVar1 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00123bc0;
  puVar2 = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00123bc0;
  puVar3 = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  local_330 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00123bc0;
  puVar4 = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  iVar13 = (flags & 1) + 1;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      sVar5 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      if (local_190.bigits_.super_buffer<unsigned_int>.capacity_ <
          local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
        (**local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                  (&local_190,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
      }
      local_190.bigits_.super_buffer<unsigned_int>.size_ =
           local_190.bigits_.super_buffer<unsigned_int>.capacity_;
      if (sVar5 <= local_190.bigits_.super_buffer<unsigned_int>.capacity_) {
        local_190.bigits_.super_buffer<unsigned_int>.size_ = sVar5;
      }
      if (sVar5 != 0) {
        memmove(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar5 << 2);
      }
      sVar5 = local_2f0.bigits_.super_buffer<unsigned_int>.size_;
      local_190.exp_ = local_2f0.exp_;
      if ((flags & 1) == 0) {
        local_330 = (bigint *)0x0;
      }
      else {
        if (local_e0.bigits_.super_buffer<unsigned_int>.capacity_ <
            local_2f0.bigits_.super_buffer<unsigned_int>.size_) {
          (**local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer)
                    (&local_e0,local_2f0.bigits_.super_buffer<unsigned_int>.size_);
        }
        local_e0.bigits_.super_buffer<unsigned_int>.size_ =
             local_e0.bigits_.super_buffer<unsigned_int>.capacity_;
        if (sVar5 <= local_e0.bigits_.super_buffer<unsigned_int>.capacity_) {
          local_e0.bigits_.super_buffer<unsigned_int>.size_ = sVar5;
        }
        if (sVar5 != 0) {
          memmove(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,sVar5 << 2);
        }
        local_330 = &local_e0;
        local_e0.exp_ = local_2f0.exp_;
        bigint::operator<<=(local_330,1);
      }
      value_00._8_4_ = in_stack_fffffffffffffcc0;
      value_00._0_8_ = buf;
      value_00._12_4_ = in_stack_fffffffffffffcc4;
      bigint::operator*=(&local_2f0,(unsigned___int128)value_00);
      bigint::operator<<=(&local_2f0,iVar13);
      bigint::assign<unsigned_long,_0>(&local_240,1);
      bigint::operator<<=(&local_240,iVar13 - value.e);
    }
    else {
      n_00._8_4_ = in_stack_fffffffffffffcc0;
      n_00._0_8_ = buf;
      n_00._12_4_ = in_stack_fffffffffffffcc4;
      bigint::operator=(&local_2f0,(unsigned___int128)n_00);
      bigint::operator<<=(&local_2f0,iVar13);
      bigint::assign_pow10(&local_240,*exp10);
      bigint::operator<<=(&local_240,iVar13 - value.e);
      bigint::assign<unsigned_long,_0>(&local_190,1);
      if ((flags & 1) == 0) {
        local_330 = (bigint *)0x0;
      }
      else {
        bigint::assign<unsigned_long,_0>(&local_e0,2);
      }
    }
  }
  else {
    n._8_4_ = in_stack_fffffffffffffcc0;
    n._0_8_ = buf;
    n._12_4_ = in_stack_fffffffffffffcc4;
    bigint::operator=(&local_2f0,(unsigned___int128)n);
    bigint::operator<<=(&local_2f0,value.e + iVar13);
    bigint::assign<unsigned_long,_0>(&local_190,1);
    bigint::operator<<=(&local_190,value.e);
    if ((flags & 1) == 0) {
      local_330 = (bigint *)0x0;
    }
    else {
      local_330 = &local_e0;
      bigint::assign<unsigned_long,_0>(local_330,1);
      bigint::operator<<=(&local_e0,value.e + 1);
    }
    bigint::assign_pow10(&local_240,*exp10);
    bigint::operator<<=(&local_240,iVar13);
  }
  uVar7 = ~(uint)value.f & 1;
  lhs2 = &local_190;
  if (local_330 != (bigint *)0x0) {
    lhs2 = local_330;
  }
  if ((flags & 2) != 0) {
    iVar13 = add_compare(&local_2f0,lhs2,&local_240);
    if (iVar13 + uVar7 == 0 || SCARRY4(iVar13,uVar7) != (int)(iVar13 + uVar7) < 0) {
      *exp10 = *exp10 + -1;
      bigint::multiply(&local_2f0,10);
      if ((num_digits < 0) && (bigint::multiply(&local_190,10), local_330 != (bigint *)0x0)) {
        bigint::multiply(lhs2,10);
      }
    }
    if ((flags & 4) != 0) {
      iVar13 = *exp10;
      if (0x7ffffffe - iVar13 < num_digits && -1 < iVar13) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"number is too big");
        *(undefined ***)this = &PTR__runtime_error_00123b00;
        __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar11 = (ulong)(num_digits + iVar13 + 1);
    }
  }
  iVar13 = (int)uVar11;
  if (-1 < iVar13) {
    *exp10 = *exp10 - (iVar13 + -1);
    uVar7 = iVar13 - 1;
    if (iVar13 == 0) {
      bigint::multiply(&local_240,10);
      iVar13 = add_compare(&local_2f0,&local_2f0,&local_240);
      if (buf->capacity_ < buf->size_ + 1) {
        (**buf->_vptr_buffer)(buf);
      }
      sVar5 = buf->size_;
      buf->size_ = sVar5 + 1;
      buf->ptr_[sVar5] = 0 < iVar13 | 0x30;
    }
    else {
      if (buf->capacity_ < uVar11) {
        (**buf->_vptr_buffer)(buf,uVar11);
      }
      uVar12 = buf->capacity_;
      if (uVar11 <= buf->capacity_) {
        uVar12 = uVar11;
      }
      buf->size_ = uVar12;
      if (1 < iVar13) {
        uVar12 = 0;
        do {
          iVar9 = bigint::divmod_assign(&local_2f0,&local_240);
          buf->ptr_[uVar12] = (char)iVar9 + '0';
          bigint::multiply(&local_2f0,10);
          uVar12 = uVar12 + 1;
        } while (uVar7 != uVar12);
      }
      uVar10 = bigint::divmod_assign(&local_2f0,&local_240);
      iVar9 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar9) || ((uVar10 & 1) != 0 && iVar9 == 0)) {
        if (uVar10 == 9) {
          buf->ptr_[(int)uVar7] = ':';
          if (1 < iVar13) {
            lVar14 = uVar11 + 1;
            do {
              if (buf->ptr_[lVar14 + -2] != ':') break;
              buf->ptr_[lVar14 + -2] = '0';
              buf->ptr_[lVar14 + -3] = buf->ptr_[lVar14 + -3] + '\x01';
              lVar14 = lVar14 + -1;
            } while (2 < lVar14);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_00114385;
        }
        uVar10 = uVar10 + 1;
      }
      buf->ptr_[(int)uVar7] = (char)uVar10 + '0';
    }
    goto LAB_00114385;
  }
  pcVar6 = buf->ptr_;
  iVar13 = -uVar7;
  lVar14 = 0;
  while( true ) {
    uVar10 = bigint::divmod_assign(&local_2f0,&local_240);
    iVar9 = compare(&local_2f0,&local_190);
    iVar8 = add_compare(&local_2f0,lhs2,&local_240);
    pcVar6[lVar14] = (char)uVar10 + '0';
    if ((iVar9 < (int)uVar7) || (iVar13 < iVar8)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_190,10);
    if (local_330 != (bigint *)0x0) {
      bigint::multiply(lhs2,10);
    }
    lVar14 = lVar14 + 1;
  }
  if (iVar9 < (int)uVar7) {
    if (iVar13 < iVar8) {
      iVar13 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar13) || ((uVar10 & 1) != 0 && iVar13 == 0)) goto LAB_0011417f;
    }
  }
  else {
LAB_0011417f:
    pcVar6 = pcVar6 + ((lVar14 + 1U & 0xffffffff) - 1);
    *pcVar6 = *pcVar6 + '\x01';
  }
  uVar11 = lVar14 + 1U & 0xffffffff;
  if (buf->capacity_ < uVar11) {
    (**buf->_vptr_buffer)(buf,uVar11);
  }
  if (buf->capacity_ < uVar11) {
    uVar11 = buf->capacity_;
  }
  buf->size_ = uVar11;
  *exp10 = *exp10 - (int)lVar14;
LAB_00114385:
  if (local_e0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_e0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_190.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_190.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_240.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_240.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}